

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpermutations.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  istream *piVar1;
  int i;
  size_type sVar2;
  ulong uVar3;
  char *c;
  _Alloc_hider __x;
  long lVar4;
  allocator local_2c9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string line;
  _List_base<char,_std::allocator<char>_> local_288;
  list<char,_std::allocator<char>_> chars;
  string local_258;
  ifstream stream;
  
  std::ifstream::ifstream(&stream,argv[1],_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  chars.super__List_base<char,_std::allocator<char>_>._M_impl._M_node._M_size = 0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  chars.super__List_base<char,_std::allocator<char>_>._M_impl._M_node.super__List_node_base._M_next
       = (_List_node_base *)&chars;
  chars.super__List_base<char,_std::allocator<char>_>._M_impl._M_node.super__List_node_base._M_prev
       = (_List_node_base *)&chars;
  while (piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)&stream,(string *)&line), sVar2 = line._M_string_length,
        __x = line._M_dataplus, ((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) == 0)
  {
    for (; sVar2 != 0; sVar2 = sVar2 - 1) {
      std::__cxx11::list<char,_std::allocator<char>_>::push_back(&chars,__x._M_p);
      __x._M_p = __x._M_p + 1;
    }
    std::__cxx11::list<char,_std::allocator<char>_>::list
              ((list<char,_std::allocator<char>_> *)&local_288,&chars);
    std::__cxx11::string::string((string *)&local_258,"",&local_2c9);
    genWord((list<char,_std::allocator<char>_> *)&local_288,&words,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::_List_base<char,_std::allocator<char>_>::_M_clear(&local_288);
    std::
    __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (words.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               words.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    lVar4 = 0;
    for (uVar3 = 0;
        uVar3 < (ulong)((long)words.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)words.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar3 = uVar3 + 1) {
      std::operator<<((ostream *)&std::cout,
                      (string *)
                      ((long)&((words.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar4));
      if (uVar3 == ((long)words.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)words.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      }
      else {
        std::operator<<((ostream *)&std::cout,",");
      }
      lVar4 = lVar4 + 0x20;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&words);
    std::__cxx11::list<char,_std::allocator<char>_>::clear(&chars);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&words);
  std::__cxx11::_List_base<char,_std::allocator<char>_>::_M_clear
            (&chars.super__List_base<char,_std::allocator<char>_>);
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&stream);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    ifstream stream(argv[1]);
//    ifstream stream("/home/arkezar/permut");
    string line;

    list<char> chars;
    vector<string> words;

    while (getline(stream, line)) {
        for(const auto& c : line)
            chars.push_back(c);

        genWord(chars,words,"");

        sort(words.begin(),words.end());

        for(int i = 0 ; i < words.size() ; i++){
            cout << words[i];
            if(i!=words.size()-1)
                cout << ",";
            else
                cout << endl;
        }

        words.clear();
        chars.clear();
    }
    return 0;
}